

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(TextReader<fmt::Locale> *this)

{
  char cVar1;
  char *loc;
  ArgList local_10;
  
  loc = (this->super_ReaderBase).ptr_;
  do {
    cVar1 = *loc;
    if (cVar1 == '\0') {
      local_10.types_ = 0;
      DoReportError(this,loc,(CStringRef)0x155047,&local_10);
      return;
    }
    loc = loc + 1;
    (this->super_ReaderBase).ptr_ = loc;
  } while (cVar1 != '\n');
  this->line_start_ = loc;
  this->line_ = this->line_ + 1;
  return;
}

Assistant:

void ReadTillEndOfLine() {
    while (char c = *ptr_) {
      ++ptr_;
      if (c == '\n') {
        line_start_ = ptr_;
        ++line_;
        return;
      }
    }
    DoReportError(ptr_, "expected newline");
  }